

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

IndirOpnd * __thiscall
Lowerer::GenerateFastElemISymbolOrStringIndexCommon
          (Lowerer *this,Instr *instrInsert,RegOpnd *indexOpnd,RegOpnd *baseOpnd,
          uint32 inlineCacheOffset,uint32 hitRateOffset,LabelInstr *labelHelper,FldInfoFlags flags)

{
  BYTE scale;
  RegOpnd *opndSlotArray;
  RegOpnd *opndSlotIndex;
  IndirOpnd *pIVar1;
  
  opndSlotArray = IR::RegOpnd::New(TyInt64,instrInsert->m_func);
  opndSlotIndex = IR::RegOpnd::New(TyInt64,instrInsert->m_func);
  GenerateLookUpInIndexCache
            (this,instrInsert,indexOpnd,baseOpnd,opndSlotArray,opndSlotIndex,inlineCacheOffset,
             hitRateOffset,labelHelper,flags);
  scale = LowererMDArch::GetDefaultIndirScale();
  pIVar1 = IR::IndirOpnd::New(opndSlotArray,opndSlotIndex,scale,TyInt64,instrInsert->m_func);
  return pIVar1;
}

Assistant:

IR::IndirOpnd*
Lowerer::GenerateFastElemISymbolOrStringIndexCommon(
    _In_ IR::Instr* instrInsert,
    _In_ IR::RegOpnd* indexOpnd,
    _In_ IR::RegOpnd* baseOpnd,
    _In_ const uint32 inlineCacheOffset,
    _In_ const uint32 hitRateOffset,
    _In_ IR::LabelInstr* labelHelper,
    _In_ Js::FldInfoFlags flags)
{
    // Try to look up the property in the cache, or bail to helper
    IR::RegOpnd * opndSlotArray = IR::RegOpnd::New(TyMachReg, instrInsert->m_func);
    IR::RegOpnd * opndSlotIndex = IR::RegOpnd::New(TyMachReg, instrInsert->m_func);
    GenerateLookUpInIndexCache(instrInsert, indexOpnd, baseOpnd, opndSlotArray, opndSlotIndex, inlineCacheOffset, hitRateOffset, labelHelper, flags);

    // return [opndSlotArray + opndSlotIndex * PtrSize]
    return  IR::IndirOpnd::New(opndSlotArray, opndSlotIndex, m_lowererMD.GetDefaultIndirScale(), TyMachReg, instrInsert->m_func);
}